

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::getMember
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,StringPtr name)

{
  Compiler *pCVar1;
  Reader subSource;
  undefined1 auVar2 [40];
  bool bVar3;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  NullableValue<capnp::compiler::BrandedDecl> _member1401;
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> local_338;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_2f0;
  undefined1 local_240 [8];
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_238;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_188;
  NullableValue<capnp::compiler::BrandedDecl> local_d8;
  
  local_2f0.mutex = (Mutex *)0x0;
  local_2f0.value.body.tag = 0;
  local_2f0.value.brand.disposer = (Disposer *)0x0;
  local_2f0.value.brand.ptr = (BrandScope *)0x0;
  local_2f0.value.source._reader.data = (void *)0x0;
  local_2f0.value.source._reader.pointers._0_6_ = 0;
  local_2f0.value.source._reader.pointers._6_2_ = 0;
  local_2f0.value.source._reader.dataSize = 0;
  local_2f0.value.source._reader.pointerCount = 0;
  local_2f0.value.source._reader.segment = (SegmentReader *)0x0;
  local_2f0.value.source._reader.capTable = (CapTableReader *)0x0;
  local_2f0.value.source._reader.nestingLimit = 0x7fffffff;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockShared
            (&local_338,&this->compiler->impl);
  local_308 = 0;
  local_338.mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)0x0;
  local_338.value.disposer = (Disposer *)0x0;
  local_338.value.ptr = (Impl *)0x0;
  uStack_310 = 0;
  uStack_300 = 0x7fffffff;
  auVar2 = ZEXT1640(ZEXT816(0));
  subSource._reader._40_8_ = 0x7fffffff;
  subSource._reader.segment = (SegmentReader *)auVar2._0_8_;
  subSource._reader.capTable = (CapTableReader *)auVar2._8_8_;
  subSource._reader.data = (void *)auVar2._16_8_;
  subSource._reader.pointers = (WirePointer *)auVar2._24_8_;
  subSource._reader.dataSize = auVar2._32_4_;
  subSource._reader.pointerCount = auVar2._36_2_;
  subSource._reader._38_2_ = auVar2._38_2_;
  BrandedDecl::getMember
            ((Maybe<capnp::compiler::BrandedDecl> *)&local_d8,&(this->decl).value,name,subSource);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_240,&local_d8);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_d8);
  bVar3 = local_240[0];
  if (local_240[0] == true) {
    local_2f0.mutex = (Mutex *)local_338.mutex._0_8_;
    BrandedDecl::operator=(&local_2f0.value,(BrandedDecl *)(local_240 + 8));
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_240);
  kj::Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&local_338);
  if (bVar3 == false) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pCVar1 = this->compiler;
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
              (&local_188,&local_2f0);
    local_240 = (undefined1  [8])pCVar1;
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)(local_240 + 8),&local_188);
    kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::NullableValue
              (&__return_storage_ptr__->ptr,(CompiledType *)local_240);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)(local_240 + 8));
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_188);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_2f0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::getMember(kj::StringPtr name) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    KJ_IF_SOME(member, decl.get(lock).getMember(name, {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}